

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# printer.h
# Opt level: O3

void __thiscall
google::protobuf::io::AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo>::AddAnnotation
          (AnnotationProtoCollector<google::protobuf::GeneratedCodeInfo> *this,size_t begin_offset,
          size_t end_offset,string *file_path,vector<int,_std::allocator<int>_> *path)

{
  RepeatedField<int> *this_00;
  int iVar1;
  GeneratedCodeInfo *pGVar2;
  Rep *pRVar3;
  GeneratedCodeInfo_Annotation *obj;
  void *pvVar4;
  pointer piVar5;
  int *piVar6;
  undefined8 *puVar7;
  uint uVar8;
  ulong uVar9;
  int tmp;
  
  pGVar2 = this->annotation_proto_;
  pRVar3 = (pGVar2->annotation_).super_RepeatedPtrFieldBase.rep_;
  if (pRVar3 != (Rep *)0x0) {
    iVar1 = (pGVar2->annotation_).super_RepeatedPtrFieldBase.current_size_;
    if (iVar1 < pRVar3->allocated_size) {
      (pGVar2->annotation_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
      pvVar4 = pRVar3->elements[iVar1];
      goto LAB_002392f5;
    }
  }
  obj = Arena::CreateMaybeMessage<google::protobuf::GeneratedCodeInfo_Annotation>
                  ((pGVar2->annotation_).super_RepeatedPtrFieldBase.arena_);
  pvVar4 = internal::RepeatedPtrFieldBase::AddOutOfLineHelper
                     (&(pGVar2->annotation_).super_RepeatedPtrFieldBase,obj);
LAB_002392f5:
  piVar5 = (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  if ((path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_finish != piVar5) {
    this_00 = (RepeatedField<int> *)((long)pvVar4 + 0x18);
    uVar8 = *(uint *)((long)pvVar4 + 0x18);
    uVar9 = 0;
    do {
      iVar1 = piVar5[uVar9];
      if (uVar8 == *(uint *)((long)pvVar4 + 0x1c)) {
        RepeatedField<int>::Reserve(this_00,uVar8 + 1);
        piVar6 = RepeatedField<int>::elements(this_00);
        piVar6[uVar8] = iVar1;
      }
      else {
        piVar6 = RepeatedField<int>::elements(this_00);
        piVar6[uVar8] = iVar1;
      }
      uVar8 = uVar8 + 1;
      this_00->current_size_ = uVar8;
      uVar9 = uVar9 + 1;
      piVar5 = (path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
               ._M_start;
    } while (uVar9 < (ulong)((long)(path->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                                   super__Vector_impl_data._M_finish - (long)piVar5 >> 2));
  }
  *(byte *)((long)pvVar4 + 0x10) = *(byte *)((long)pvVar4 + 0x10) | 1;
  puVar7 = (undefined8 *)(*(ulong *)((long)pvVar4 + 8) & 0xfffffffffffffffc);
  if ((*(ulong *)((long)pvVar4 + 8) & 1) != 0) {
    puVar7 = (undefined8 *)*puVar7;
  }
  internal::ArenaStringPtr::Set((ArenaStringPtr *)((long)pvVar4 + 0x30),file_path,puVar7);
  *(int *)((long)pvVar4 + 0x38) = (int)begin_offset;
  *(byte *)((long)pvVar4 + 0x10) = *(byte *)((long)pvVar4 + 0x10) | 6;
  *(int *)((long)pvVar4 + 0x3c) = (int)end_offset;
  return;
}

Assistant:

void AddAnnotation(size_t begin_offset, size_t end_offset,
                     const std::string& file_path,
                     const std::vector<int>& path) override {
    typename AnnotationProto::Annotation* annotation =
        annotation_proto_->add_annotation();
    for (int i = 0; i < path.size(); ++i) {
      annotation->add_path(path[i]);
    }
    annotation->set_source_file(file_path);
    annotation->set_begin(begin_offset);
    annotation->set_end(end_offset);
  }